

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O0

longdouble * __thiscall
TPZGaussRule::JacobiPolinomial
          (TPZGaussRule *this,longdouble x,int order,longdouble alpha,longdouble beta,
          TPZVec<long_double> *b,TPZVec<long_double> *c,longdouble *dp2,longdouble *p1)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble *plVar5;
  TPZVec<long_double> *in_RCX;
  TPZVec<long_double> *in_RDX;
  int in_ESI;
  longdouble *in_R8;
  longdouble *in_R9;
  longdouble in_stack_00000008;
  longdouble in_stack_00000018;
  longdouble in_stack_00000028;
  int i;
  longdouble dp1;
  longdouble dp0;
  longdouble p0;
  longdouble p2;
  undefined4 local_ac;
  unkbyte10 local_a8;
  unkbyte10 local_78;
  
  *in_R9 = (longdouble)1;
  local_78 = (in_stack_00000018 - in_stack_00000028) /
             ((longdouble)2.0 + in_stack_00000018 + in_stack_00000028) + in_stack_00000008;
  *in_R8 = (longdouble)1;
  local_a8 = (longdouble)0;
  for (local_ac = 2; (int)local_ac <= in_ESI; local_ac = local_ac + 1) {
    lVar1 = *in_R9;
    *in_R9 = local_78;
    lVar2 = *in_R8;
    plVar5 = TPZVec<long_double>::operator[](in_RDX,(long)(int)(local_ac - 1));
    lVar3 = *plVar5;
    lVar4 = *in_R9;
    plVar5 = TPZVec<long_double>::operator[](in_RCX,(long)(int)(local_ac - 1));
    local_78 = (in_stack_00000008 - lVar3) * lVar4 - lVar1 * *plVar5;
    plVar5 = TPZVec<long_double>::operator[](in_RDX,(long)(int)(local_ac - 1));
    lVar1 = *plVar5;
    lVar3 = *in_R9;
    plVar5 = TPZVec<long_double>::operator[](in_RCX,(long)(int)(local_ac - 1));
    *in_R8 = ((in_stack_00000008 - lVar1) * lVar2 + lVar3) - local_a8 * *plVar5;
    local_a8 = lVar2;
  }
  return (longdouble *)(ulong)local_ac;
}

Assistant:

long double TPZGaussRule::JacobiPolinomial(long double x, int order,long double alpha, long double beta, 
							TPZVec<long double> &b, TPZVec<long double> &c,long double *dp2, long double *p1 )
{
	long double p2, p0, dp0, dp1;
	int i;
	
	*p1 = 1.0L;
	dp1 = 0.0L;	
	p2 = x + (alpha - beta)/(alpha + beta + 2.0L);
	*dp2 = 1.0L;
	
	for(i=2;i<=order;i++) {
		p0 = *p1;
		dp0 = dp1;
		
		*p1 = p2;
		dp1 = *dp2;
		
		p2 = (x - b[i-1])*(*p1) - c[i-1]*p0;
		*dp2 = (x - b[i-1])*dp1 + (*p1) - c[i-1]*dp0;
	}
	return p2;
}